

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cpp
# Opt level: O2

Ray * __thiscall
CMU462::Camera::generate_ray(Ray *__return_storage_ptr__,Camera *this,double x,double y)

{
  undefined1 auVar1 [16];
  double dVar2;
  long lVar3;
  Vector3D *pVVar4;
  Matrix4x4 *pMVar5;
  byte bVar6;
  double dVar7;
  double dStack_1a0;
  Vector3D local_168;
  undefined1 local_148 [16];
  double local_138;
  Vector3D local_128 [5];
  Matrix4x4 trans;
  
  bVar6 = 0;
  dVar2 = tan((this->vFov / 180.0) * 3.141592653589793 * 0.5);
  dVar7 = this->ar;
  auVar1._8_4_ = SUB84(y + y,0);
  auVar1._0_8_ = x + x;
  auVar1._12_4_ = (int)((ulong)(y + y) >> 0x20);
  getTransformation(&trans,this);
  Matrix4x4::inv((Matrix4x4 *)local_128,&trans);
  pVVar4 = local_128;
  pMVar5 = &trans;
  for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
    pMVar5->entries[0].x = ((Vector4D *)&pVVar4->x)->x;
    pVVar4 = (Vector3D *)((long)pVVar4 + ((ulong)bVar6 * -2 + 1) * 8);
    pMVar5 = (Matrix4x4 *)((long)pMVar5 + ((ulong)bVar6 * -2 + 1) * 8);
  }
  local_128[0].x = 0.0;
  local_128[0].y = 0.0;
  local_128[0].z = 0.0;
  Matrix4x4::operator*((Vector3D *)local_148,&trans,local_128);
  local_128[0].z = local_138;
  local_128[0].x = (double)local_148._0_8_;
  local_128[0].y = (double)local_148._8_8_;
  dStack_1a0 = auVar1._8_8_;
  local_148._8_4_ = SUB84(dVar2 * dStack_1a0,0);
  local_148._0_8_ = dVar7 * dVar2 * (x + x);
  local_148._12_4_ = (int)((ulong)(dVar2 * dStack_1a0) >> 0x20);
  local_138 = -1.0;
  Matrix4x4::operator*(&local_168,&trans,(Vector3D *)local_148);
  local_138 = local_168.z;
  local_168.z = local_168.z - local_128[0].z;
  local_168.x = local_168.x - local_128[0].x;
  local_168.y = local_168.y - local_128[0].y;
  dVar7 = 1.0 / SQRT(local_168.z * local_168.z +
                     local_168.x * local_168.x + local_168.y * local_168.y);
  local_168.z = local_168.z * dVar7;
  local_168.x = dVar7 * local_168.x;
  local_168.y = dVar7 * local_168.y;
  Ray::Ray(__return_storage_ptr__,local_128,&local_168,0);
  return __return_storage_ptr__;
}

Assistant:

Ray Camera::generate_ray(double x, double y) {
	// TODO (PathTracer):
	// compute position of the input sensor sample coordinate on the
	// canonical sensor plane one unit away from the pinhole.
	double v_fov_rad = v_fov() / 180.0*PI;
	double H = tan(v_fov_rad / 2);
	double W = aspect_ratio() * H;

	x = x / 0.5* W;
	y = y / 0.5* H;

	Matrix4x4 trans = getTransformation();
	trans = trans.inv();

	Vector3D origin(0, 0, 0);
	origin = trans * origin;

	Vector3D p(x, y, -1);
	p = trans * p;

	Vector3D direction = p - origin;

	return Ray(origin, direction.unit());
}